

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SaturationAlgorithm.cpp
# Opt level: O2

void __thiscall Saturation::SaturationAlgorithm::onPassiveAdded(SaturationAlgorithm *this,Clause *c)

{
  ostream *poVar1;
  string local_40;
  
  if ((*(char *)(Lib::env + 0x913a) != '\0') || ((*(byte *)(Lib::env + 0xa022) & 1) != 0)) {
    poVar1 = std::operator<<((ostream *)&std::cout,"[SA] passive: ");
    Kernel::Clause::toString_abi_cxx11_(&local_40,c);
    poVar1 = std::operator<<(poVar1,(string *)&local_40);
    std::endl<char,std::char_traits<char>>(poVar1);
    std::__cxx11::string::~string((string *)&local_40);
  }
  onNonRedundantClause(this,c);
  return;
}

Assistant:

void SaturationAlgorithm::onPassiveAdded(Clause* c)
{
  if (env.options->showPassive()) {
    std::cout << "[SA] passive: " << c->toString() << std::endl;
  }

  //when a clause is added to the passive container,
  //we know it is not redundant
  onNonRedundantClause(c);
}